

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int int_x509_param_set1(char **pdest,size_t *pdestlen,char *src,size_t srclen)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = 0;
  if (srclen != 0 && src != (char *)0x0) {
    pcVar1 = (char *)OPENSSL_memdup(src,srclen);
    iVar2 = 0;
    if (pcVar1 != (char *)0x0) {
      if (*pdest != (char *)0x0) {
        OPENSSL_free(*pdest);
      }
      *pdest = pcVar1;
      iVar2 = 1;
      if (pdestlen != (size_t *)0x0) {
        *pdestlen = srclen;
      }
    }
  }
  return iVar2;
}

Assistant:

static int int_x509_param_set1(char **pdest, size_t *pdestlen, const char *src,
                               size_t srclen) {
  void *tmp;
  if (src == NULL || srclen == 0) {
    // Unlike OpenSSL, we do not allow an empty string to disable previously
    // configured checks.
    return 0;
  }

  tmp = OPENSSL_memdup(src, srclen);
  if (!tmp) {
    return 0;
  }

  if (*pdest) {
    OPENSSL_free(*pdest);
  }
  *pdest = reinterpret_cast<char *>(tmp);
  if (pdestlen) {
    *pdestlen = srclen;
  }
  return 1;
}